

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::NameMapper::GetDefaultExpression
          (NameMapper *this,MultiFileColumnDefinition *column,bool is_root)

{
  MultiFileColumnMapper *this_00;
  BoundConstantExpression *this_01;
  undefined8 extraout_RAX;
  char in_CL;
  undefined7 in_register_00000011;
  MultiFileColumnDefinition *this_02;
  LogicalType local_b0;
  Value local_98;
  Value local_58;
  
  this_02 = (MultiFileColumnDefinition *)CONCAT71(in_register_00000011,is_root);
  if ((this_02->default_expression).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    if (in_CL != '\0') {
      this_00 = (MultiFileColumnMapper *)(column->name)._M_string_length;
      MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_((string *)&local_98,this_02);
      MultiFileColumnMapper::ThrowColumnNotFoundError(this_00,(string *)&local_98);
      Value::~Value(&local_98);
      operator_delete(&local_98);
      Value::~Value(&local_58);
      LogicalType::~LogicalType(&local_b0);
      _Unwind_Resume(extraout_RAX);
    }
    LogicalType::LogicalType(&local_b0,&this_02->type);
    Value::Value(&local_58,&local_b0);
    this_01 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_98,&local_58);
    BoundConstantExpression::BoundConstantExpression(this_01,&local_98);
    Value::~Value(&local_98);
    (this->super_ColumnMapper)._vptr_ColumnMapper = (_func_int **)this_01;
    Value::~Value(&local_58);
    LogicalType::~LogicalType(&local_b0);
  }
  else {
    FieldIdMapper::GetDefault((FieldIdMapper *)this,this_02);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> GetDefaultExpression(const MultiFileColumnDefinition &column, bool is_root) const override {
		if (column.default_expression) {
			// we have an explicit default - return it
			return FieldIdMapper::GetDefault(column);
		}
		// no explicit default and no match
		if (is_root) {
			// no match found in a root column - throw an error
			mapper.ThrowColumnNotFoundError(column.GetIdentifierName());
		}
		// no match found in a struct field - replace with NULL
		return make_uniq<BoundConstantExpression>(Value(column.type));
	}